

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall bandit::context::bandit::throw_if_executing(bandit *this,string *method)

{
  test_run_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *method_local;
  bandit *this_local;
  
  if ((this->is_executing_ & 1U) != 0) {
    local_18 = method;
    method_local = (string *)this;
    this_00 = (test_run_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_58,"\'",local_18);
    std::operator+(&local_38,&local_58,"\' was called after \'describe\' or \'it\'");
    detail::test_run_error::test_run_error(this_00,&local_38);
    __cxa_throw(this_00,&detail::test_run_error::typeinfo,detail::test_run_error::~test_run_error);
  }
  return;
}

Assistant:

void throw_if_executing(std::string&& method) const {
        if (is_executing_) {
          throw detail::test_run_error("'" + method + "' was called after 'describe' or 'it'");
        }
      }